

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O3

void dbg_print_buf(void *buf,uint64_t buflen,bool hex,int align)

{
  undefined8 in_RAX;
  
  if (buf == (void *)0x0) {
    dbg_print_buf();
  }
  else {
    if (!hex) {
      fprintf(_stderr,"%.*s\n",buflen & 0xffffffff,buf,in_RAX);
      return;
    }
    dbg_print_buf();
  }
  return;
}

Assistant:

void dbg_print_buf(void *buf, uint64_t buflen, bool hex, int align)
{
    if (!buf) {
        fprintf(stderr, "(null)\n");
        return;
    }

    if (!hex) {
        // plaintext
        fprintf(stderr, "%.*s\n", (int)buflen, (char*)buf);
        return;
    }

    // hex dump
    size_t i, j;
    fprintf(stderr, "(hex) 0x%" _X64 ", %" _F64 " (0x%" _X64 ") bytes\n",
            (uint64_t)buf, buflen, buflen);
    for (i=0;i<buflen;i+=align) {
        fprintf(stderr, "   %04x   ", (int)i);
        for (j=i; j<i+align; ++j){
            if (j<buflen) {
                fprintf(stderr, "%02x ", ((uint8_t*)buf)[j]);
            } else {
                fprintf(stderr, "   ");
            }
            if ((j+1)%8 == 0) {
                fprintf(stderr, " ");
            }
        }
        fprintf(stderr, " ");
        for (j=i; j<i+align && j<buflen; ++j){
            // print only readable ascii character
            fprintf(stderr, "%c",
             (0x20 <= ((char*)buf)[j] && ((char*)buf)[j] <= 0x7d)?
                       ((char*)buf)[j] : '.'  );
        }
        fprintf(stderr, "\n");
    }
}